

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O2

bool __thiscall S2Polyline::NearlyCovers(S2Polyline *this,S2Polyline *covered,S1Angle max_error)

{
  int k;
  int k_00;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int k_01;
  int k_02;
  S2Point *pSVar4;
  S2Point *pSVar5;
  S2Point *b;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr *pp_Var7;
  SearchState *b_00;
  SearchState *extraout_RDX;
  SearchState *extraout_RDX_00;
  _Rb_tree_node_base *p_Var8;
  uint k_03;
  uint index;
  undefined1 auVar9 [16];
  SearchState state;
  undefined1 local_e0 [8];
  bool bStack_d8;
  undefined7 uStack_d7;
  VType local_d0;
  S2Point j_begin;
  S2Point closest_point;
  vector<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
  pending;
  S1Angle local_68;
  set<(anonymous_namespace)::SearchState,_(anonymous_namespace)::SearchStateKeyCompare,_std::allocator<(anonymous_namespace)::SearchState>_>
  done;
  
  if (covered->num_vertices_ == 0) {
    bVar1 = true;
  }
  else if (this->num_vertices_ == 0) {
    bVar1 = false;
  }
  else {
    pending.
    super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    pending.
    super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pending.
    super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    done._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &done._M_t._M_impl.super__Rb_tree_header._M_header;
    done._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    done._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    done._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    done._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         done._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    uVar3 = anon_unknown.dwarf_4bb61d::NextDistinctVertex(this,0);
    index = 0;
LAB_0024bd58:
    k_03 = index;
    index = uVar3;
    if ((int)index < this->num_vertices_) {
      uVar3 = anon_unknown.dwarf_4bb61d::NextDistinctVertex(this,index);
      pSVar4 = vertex(covered,0);
      pSVar5 = vertex(this,k_03);
      b = vertex(this,index);
      S2::Project(&closest_point,pSVar4,pSVar5,b);
      if (uVar3 != this->num_vertices_) goto code_r0x0024bdb3;
      goto LAB_0024bdce;
    }
LAB_0024be2e:
    bVar1 = pending.
            super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            pending.
            super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
            ._M_impl.super__Vector_impl_data._M_finish;
    if (bVar1) {
      state._8_4_ = *(undefined4 *)
                     &pending.
                      super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].i_in_progress;
      b_00 = (SearchState *)(ulong)(uint)state._8_4_;
      state.i = pending.
                super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].i;
      state.j = pending.
                super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].j;
      bVar2 = true;
      pp_Var7 = &done._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var8 = &done._M_t._M_impl.super__Rb_tree_header._M_header;
      pending.
      super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           pending.
           super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
      while( true ) {
        auVar9._8_8_ = b_00;
        auVar9._0_8_ = p_Var8;
        p_Var6 = *pp_Var7;
        if (p_Var6 == (_Rb_tree_node_base *)0x0) break;
        bVar2 = anon_unknown.dwarf_4bb61d::SearchStateKeyCompare::operator()
                          ((SearchStateKeyCompare *)&state,(SearchState *)(p_Var6 + 1),b_00);
        pp_Var7 = &p_Var6->_M_left + !bVar2;
        b_00 = extraout_RDX;
        p_Var8 = p_Var6;
      }
      if (bVar2 == false) goto LAB_0024bebb;
      if (p_Var8 != done._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
        auVar9 = std::_Rb_tree_decrement(p_Var8);
        goto LAB_0024bebb;
      }
      goto LAB_0024becf;
    }
LAB_0024c126:
    std::
    set<(anonymous_namespace)::SearchState,_(anonymous_namespace)::SearchStateKeyCompare,_std::allocator<(anonymous_namespace)::SearchState>_>
    ::~set(&done);
    std::
    vector<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
    ::~vector(&pending);
  }
  return bVar1;
code_r0x0024bdb3:
  pSVar4 = vertex(this,index);
  bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                    ((BasicVector<Vector3,_double,_3UL> *)&closest_point,pSVar4);
  if (bVar1) {
LAB_0024bdce:
    pSVar4 = vertex(covered,0);
    S1Angle::S1Angle(&local_68,&closest_point,pSVar4);
    if (local_68.radians_ <= max_error.radians_) {
      j_begin.c_[0] = (VType)(ulong)k_03;
      j_begin.c_[1] = (VType)CONCAT71(j_begin.c_[1]._1_7_,1);
      std::
      vector<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
      ::push_back(&pending,(value_type *)&j_begin);
    }
  }
  goto LAB_0024bd58;
LAB_0024bebb:
  bVar2 = anon_unknown.dwarf_4bb61d::SearchStateKeyCompare::operator()
                    ((SearchStateKeyCompare *)(auVar9._0_8_ + 0x20),&state,auVar9._8_8_);
  b_00 = extraout_RDX_00;
  if (bVar2) {
LAB_0024becf:
    if (&done._M_t._M_impl.super__Rb_tree_header == (_Rb_tree_header *)p_Var8) {
      bVar2 = true;
    }
    else {
      bVar2 = anon_unknown.dwarf_4bb61d::SearchStateKeyCompare::operator()
                        ((SearchStateKeyCompare *)&state,(SearchState *)(p_Var8 + 1),b_00);
    }
    p_Var6 = (_Rb_tree_node_base *)operator_new(0x30);
    *(undefined4 *)&p_Var6[1]._M_parent = state._8_4_;
    p_Var6[1]._M_color = state.i;
    *(int *)&p_Var6[1].field_0x4 = state.j;
    std::_Rb_tree_insert_and_rebalance
              (bVar2,p_Var6,p_Var8,&done._M_t._M_impl.super__Rb_tree_header._M_header);
    done._M_t._M_impl.super__Rb_tree_header._M_node_count =
         done._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
    k = state.i;
    k_01 = anon_unknown.dwarf_4bb61d::NextDistinctVertex(this,state.i);
    k_00 = state.j;
    k_02 = anon_unknown.dwarf_4bb61d::NextDistinctVertex(covered,state.j);
    if (k_02 == covered->num_vertices_) goto LAB_0024c126;
    if (k_01 != this->num_vertices_) {
      closest_point.c_[2] = 0.0;
      j_begin.c_[2] = 0.0;
      closest_point.c_[0] = 0.0;
      closest_point.c_[1] = 0.0;
      j_begin.c_[0] = 0.0;
      j_begin.c_[1] = 0.0;
      if (state.i_in_progress == true) {
        pSVar4 = vertex(covered,k_00);
        j_begin.c_[2] = pSVar4->c_[2];
        j_begin.c_[0] = pSVar4->c_[0];
        j_begin.c_[1] = pSVar4->c_[1];
        pSVar4 = vertex(this,k);
        pSVar5 = vertex(this,k_01);
        S2::Project((S2Point *)local_e0,&j_begin,pSVar4,pSVar5);
        closest_point.c_[2] = local_d0;
        closest_point.c_[0] = (VType)CONCAT44(local_e0._4_4_,local_e0._0_4_);
        closest_point.c_[1] = (VType)CONCAT71(uStack_d7,bStack_d8);
      }
      else {
        pSVar4 = vertex(this,k);
        closest_point.c_[2] = pSVar4->c_[2];
        closest_point.c_[0] = pSVar4->c_[0];
        closest_point.c_[1] = pSVar4->c_[1];
        pSVar4 = vertex(covered,k_00);
        pSVar5 = vertex(covered,k_02);
        S2::Project((S2Point *)local_e0,&closest_point,pSVar4,pSVar5);
        j_begin.c_[2] = local_d0;
        j_begin.c_[0] = (VType)CONCAT44(local_e0._4_4_,local_e0._0_4_);
        j_begin.c_[1] = (VType)CONCAT71(uStack_d7,bStack_d8);
      }
      pSVar4 = vertex(covered,k_02);
      pSVar5 = vertex(this,k_01);
      bVar1 = S2::IsEdgeBNearEdgeA(&j_begin,pSVar4,&closest_point,pSVar5,max_error);
      if (bVar1) {
        local_e0._4_4_ = k_00;
        bStack_d8 = false;
        local_e0._0_4_ = k_01;
        std::
        vector<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
        ::push_back(&pending,(value_type *)local_e0);
      }
      pSVar4 = vertex(this,k_01);
      pSVar5 = vertex(covered,k_02);
      bVar1 = S2::IsEdgeBNearEdgeA(&closest_point,pSVar4,&j_begin,pSVar5,max_error);
      if (bVar1) {
        local_e0._0_4_ = k;
        bStack_d8 = true;
        local_e0._4_4_ = k_02;
        std::
        vector<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
        ::push_back(&pending,(value_type *)local_e0);
      }
    }
  }
  goto LAB_0024be2e;
}

Assistant:

bool S2Polyline::NearlyCovers(const S2Polyline& covered,
                              S1Angle max_error) const {
  // NOTE: This algorithm is described assuming that adjacent vertices in a
  // polyline are never at the same point.  That is, the ith and i+1th vertices
  // of a polyline are never at the same point in space.  The implementation
  // does not make this assumption.

  // DEFINITIONS:
  //   - edge "i" of a polyline is the edge from the ith to i+1th vertex.
  //   - covered_j is a polyline consisting of edges 0 through j of "covered."
  //   - this_i is a polyline consisting of edges 0 through i of this polyline.
  //
  // A search state is represented as an (int, int, bool) tuple, (i, j,
  // i_in_progress).  Using the "drive a car" analogy from the header comment, a
  // search state signifies that you can drive one car along "covered" from its
  // first vertex through a point on its jth edge, and another car along this
  // polyline from some point on or before its ith edge to a to a point on its
  // ith edge, such that no car ever goes backward, and the cars are always
  // within "max_error" of each other.  If i_in_progress is true, it means that
  // you can definitely drive along "covered" through the jth vertex (beginning
  // of the jth edge). Otherwise, you can definitely drive along "covered"
  // through the point on the jth edge of "covered" closest to the ith vertex of
  // this polyline.
  //
  // The algorithm begins by finding all edges of this polyline that are within
  // "max_error" of the first vertex of "covered," and adding search states
  // representing all of these possible starting states to the stack of
  // "pending" states.
  //
  // The algorithm proceeds by popping the next pending state,
  // (i,j,i_in_progress), off of the stack.  First it checks to see if that
  // state represents finding a valid covering of "covered" and returns true if
  // so.  Next, if the state represents reaching the end of this polyline
  // without finding a successful covering, the algorithm moves on to the next
  // state in the stack.  Otherwise, if state (i+1,j,false) is valid, it is
  // added to the stack of pending states.  Same for state (i,j+1,true).
  //
  // We need the stack because when "i" and "j" can both be incremented,
  // sometimes only one choice leads to a solution.  We use a set to keep track
  // of visited states to avoid duplicating work.  With the set, the worst-case
  // number of states examined is O(n+m) where n = this->num_vertices() and m =
  // covered.num_vertices().  Without it, the amount of work could be as high as
  // O((n*m)^2).  Using set, the running time is O((n*m) log (n*m)).
  //
  // TODO(user): Benchmark this, and see if the set is worth it.

  if (covered.num_vertices() == 0) return true;
  if (this->num_vertices() == 0) return false;

  vector<SearchState> pending;
  set<SearchState, SearchStateKeyCompare> done;

  // Find all possible starting states.
  for (int i = 0, next_i = NextDistinctVertex(*this, 0), next_next_i;
       next_i < this->num_vertices(); i = next_i, next_i = next_next_i) {
    next_next_i = NextDistinctVertex(*this, next_i);
    S2Point closest_point = S2::Project(
        covered.vertex(0), this->vertex(i), this->vertex(next_i));

    // In order to avoid duplicate starting states, we exclude the end vertex
    // of each edge *except* for the last non-degenerate edge.
    if ((next_next_i == this->num_vertices() ||
         closest_point != this->vertex(next_i)) &&
        S1Angle(closest_point, covered.vertex(0)) <= max_error) {
      pending.push_back(SearchState(i, 0, true));
    }
  }

  while (!pending.empty()) {
    const SearchState state = pending.back();
    pending.pop_back();
    if (!done.insert(state).second) continue;

    const int next_i = NextDistinctVertex(*this, state.i);
    const int next_j = NextDistinctVertex(covered, state.j);
    if (next_j == covered.num_vertices()) {
      return true;
    } else if (next_i == this->num_vertices()) {
      continue;
    }

    S2Point i_begin, j_begin;
    if (state.i_in_progress) {
      j_begin = covered.vertex(state.j);
      i_begin = S2::Project(
          j_begin, this->vertex(state.i), this->vertex(next_i));
    } else {
      i_begin = this->vertex(state.i);
      j_begin = S2::Project(
          i_begin, covered.vertex(state.j), covered.vertex(next_j));
    }

    if (S2::IsEdgeBNearEdgeA(j_begin, covered.vertex(next_j),
                             i_begin, this->vertex(next_i), max_error)) {
      pending.push_back(SearchState(next_i, state.j, false));
    }
    if (S2::IsEdgeBNearEdgeA(i_begin, this->vertex(next_i),
                             j_begin, covered.vertex(next_j), max_error)) {
      pending.push_back(SearchState(state.i, next_j, true));
    }
  }
  return false;
}